

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_x86.h
# Opt level: O3

void aom_dc_predictor_32x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint8_t uVar6;
  
  auVar1 = vpsadbw_avx((undefined1  [16])0x0,*(undefined1 (*) [16])above);
  auVar2 = vpsadbw_avx((undefined1  [16])0x0,*(undefined1 (*) [16])(above + 0x10));
  auVar1 = vpaddw_avx(auVar2,auVar1);
  auVar3 = vpshufd_avx(auVar1,0xee);
  auVar2 = vpsadbw_avx((undefined1  [16])0x0,*(undefined1 (*) [16])left);
  auVar4 = vpshufd_avx(auVar2,0xee);
  auVar1 = vpaddw_avx(auVar1,auVar2);
  auVar1 = vpaddw_avx(auVar1,auVar4);
  auVar1 = vpaddw_avx(auVar1,auVar3);
  uVar6 = (uint8_t)((auVar1._0_4_ + 0x18U & 0xffff) / 0x30);
  iVar5 = 0x10;
  do {
    *dst = uVar6;
    dst[1] = uVar6;
    dst[2] = uVar6;
    dst[3] = uVar6;
    dst[4] = uVar6;
    dst[5] = uVar6;
    dst[6] = uVar6;
    dst[7] = uVar6;
    dst[8] = uVar6;
    dst[9] = uVar6;
    dst[10] = uVar6;
    dst[0xb] = uVar6;
    dst[0xc] = uVar6;
    dst[0xd] = uVar6;
    dst[0xe] = uVar6;
    dst[0xf] = uVar6;
    dst[0x10] = uVar6;
    dst[0x11] = uVar6;
    dst[0x12] = uVar6;
    dst[0x13] = uVar6;
    dst[0x14] = uVar6;
    dst[0x15] = uVar6;
    dst[0x16] = uVar6;
    dst[0x17] = uVar6;
    dst[0x18] = uVar6;
    dst[0x19] = uVar6;
    dst[0x1a] = uVar6;
    dst[0x1b] = uVar6;
    dst[0x1c] = uVar6;
    dst[0x1d] = uVar6;
    dst[0x1e] = uVar6;
    dst[0x1f] = uVar6;
    dst = dst + stride;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

static inline __m128i dc_sum_32_sse2(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x0 = _mm_add_epi16(x0, x1);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}